

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_compress_advanced_internal
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_CCtx_params params)

{
  ZSTDMT_bufferPool *bufPool;
  ZSTDMT_seqPool *seqPool;
  void *pvVar1;
  ZSTDMT_jobDescription *pZVar2;
  ZSTD_frameParameters fParams;
  ZSTD_CCtx_params params_00;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  unsigned_long_long uVar6;
  ZSTDMT_CCtx *local_2a8;
  ZSTD_CDict *local_2a0;
  size_t local_298;
  buffer_t *local_290;
  char *local_288;
  uint local_25c;
  char *local_250;
  U32 checksum;
  size_t cSize;
  ZSTDMT_CCtx *pZStack_218;
  uint jobID;
  size_t dstPos;
  size_t error;
  size_t dictSize;
  buffer_t dstBuffer;
  buffer_t dstAsBuffer;
  size_t dstBufferCapacity;
  size_t jobSize;
  uint u;
  size_t err_code;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  void *pvStack_138;
  uint local_130;
  ZSTD_strategy ZStack_12c;
  int local_128;
  ZSTD_CCtx *local_120;
  ZSTD_CCtx *cctx;
  size_t dstBufferPos;
  size_t frameStartPos;
  char *pcStack_100;
  uint compressWithinDst;
  size_t remainingSrcSize;
  char *srcStart;
  size_t avgJobSize;
  size_t proposedJobSize;
  size_t sStack_d8;
  uint nbJobs;
  size_t overlapSize;
  ZSTD_CCtx_params jobParams;
  ZSTD_CDict *cdict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTDMT_CCtx *mtctx_local;
  
  jobParams.customMem.opaque = cdict;
  ZSTDMT_initJobCCtxParams((ZSTD_CCtx_params *)&overlapSize,&params);
  sStack_d8 = ZSTDMT_computeOverlapSize(&params);
  proposedJobSize._4_4_ = ZSTDMT_computeNbJobs(&params,srcSize,params.nbWorkers);
  avgJobSize = (srcSize + (proposedJobSize._4_4_ - 1)) / (ulong)proposedJobSize._4_4_;
  local_250 = (char *)avgJobSize;
  if (((ulong)(avgJobSize + -1) & 0x1ffff) < 0x7fff) {
    local_250 = (char *)(avgJobSize + 0xffff);
  }
  srcStart = local_250;
  pcStack_100 = (char *)srcSize;
  remainingSrcSize = (size_t)src;
  sVar5 = ZSTD_compressBound(srcSize);
  if (dstCapacity < sVar5) {
    sVar5 = ZSTD_compressBound((size_t)srcStart);
    local_25c = (uint)(dstCapacity / sVar5);
  }
  else {
    local_25c = proposedJobSize._4_4_;
  }
  frameStartPos._4_4_ = local_25c;
  dstBufferPos = 0;
  cctx = (ZSTD_CCtx *)0x0;
  if (jobParams.attachDictPref != ZSTD_dictDefaultAttach) {
    __assert_fail("jobParams.nbWorkers == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f4d,
                  "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                 );
  }
  if (mtctx->cctxPool->totalCCtx != params.nbWorkers) {
    __assert_fail("mtctx->cctxPool->totalCCtx == params.nbWorkers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f4e,
                  "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                 );
  }
  if (proposedJobSize._4_4_ == 1 || params.nbWorkers < 2) {
    local_120 = mtctx->cctxPool->cctx[0];
    if (jobParams.customMem.opaque == (void *)0x0) {
      mtctx_local = (ZSTDMT_CCtx *)
                    ZSTD_compress_advanced_internal
                              (local_120,dst,dstCapacity,src,srcSize,(void *)0x0,0,
                               (ZSTD_CCtx_params *)&overlapSize);
    }
    else {
      local_130 = jobParams.cParams.targetLength;
      ZStack_12c = jobParams.cParams.strategy;
      local_128 = jobParams.fParams.contentSizeFlag;
      fParams.noDictIDFlag = jobParams.fParams.contentSizeFlag;
      fParams.contentSizeFlag = jobParams.cParams.targetLength;
      fParams.checksumFlag = jobParams.cParams.strategy;
      mtctx_local = (ZSTDMT_CCtx *)
                    ZSTD_compress_usingCDict_advanced
                              (local_120,dst,dstCapacity,src,srcSize,
                               (ZSTD_CDict *)jobParams.customMem.opaque,fParams);
    }
  }
  else {
    if (srcStart < (char *)0x40000) {
      __assert_fail("avgJobSize >= 256 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4f5b,
                    "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                   );
    }
    bufPool = mtctx->bufPool;
    sVar5 = ZSTD_compressBound((size_t)srcStart);
    ZSTDMT_setBufferSize(bufPool,sVar5);
    seqPool = mtctx->seqPool;
    memcpy(&err_code,&params,0x90);
    params_00.cParams.chainLog = (int)uStack_1b8;
    params_00.format = (undefined4)err_code;
    params_00.cParams.windowLog = err_code._4_4_;
    params_00.cParams.hashLog = (int)((ulong)uStack_1b8 >> 0x20);
    params_00.cParams.searchLog = (undefined4)uStack_1b0;
    params_00.cParams.minMatch = uStack_1b0._4_4_;
    params_00.cParams.targetLength = (undefined4)uStack_1a8;
    params_00.cParams.strategy = uStack_1a8._4_4_;
    params_00.fParams.contentSizeFlag = (undefined4)local_1a0;
    params_00.fParams.checksumFlag = local_1a0._4_4_;
    params_00.fParams.noDictIDFlag = (undefined4)uStack_198;
    params_00.compressionLevel = uStack_198._4_4_;
    params_00._48_8_ = uStack_190;
    params_00.targetCBlockSize = uStack_188;
    params_00.srcSizeHint = (undefined4)local_180;
    params_00.attachDictPref = local_180._4_4_;
    params_00.literalCompressionMode = (undefined4)uStack_178;
    params_00.nbWorkers = uStack_178._4_4_;
    params_00.jobSize = uStack_170;
    params_00.overlapLog = (undefined4)uStack_168;
    params_00.rsyncable = uStack_168._4_4_;
    params_00.ldmParams.enableLdm = (undefined4)uStack_160;
    params_00.ldmParams.hashLog = uStack_160._4_4_;
    params_00.ldmParams.bucketSizeLog = (undefined4)uStack_158;
    params_00.ldmParams.minMatchLength = uStack_158._4_4_;
    params_00.ldmParams.hashRateLog = (undefined4)local_150;
    params_00.ldmParams.windowLog = local_150._4_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_148;
    params_00.customMem.customFree = (ZSTD_freeFunction)uStack_140;
    params_00.customMem.opaque = pvStack_138;
    iVar3 = ZSTDMT_serialState_reset
                      (&mtctx->serial,seqPool,params_00,(size_t)srcStart,(void *)0x0,0);
    if (iVar3 == 0) {
      mtctx_local = (ZSTDMT_CCtx *)ZSTDMT_expandJobsTable(mtctx,proposedJobSize._4_4_);
      uVar4 = ERR_isError((size_t)mtctx_local);
      if (uVar4 == 0) {
        for (jobSize._4_4_ = 0; jobSize._4_4_ < proposedJobSize._4_4_;
            jobSize._4_4_ = jobSize._4_4_ + 1) {
          if (pcStack_100 < srcStart) {
            local_288 = pcStack_100;
          }
          else {
            local_288 = srcStart;
          }
          sVar5 = ZSTD_compressBound((size_t)local_288);
          dstBuffer.capacity = (long)dst + (long)cctx;
          if (jobSize._4_4_ < frameStartPos._4_4_) {
            local_290 = (buffer_t *)&dstBuffer.capacity;
          }
          else {
            local_290 = &g_nullBuffer;
          }
          pvVar1 = local_290->start;
          dstBuffer.start = (void *)local_290->capacity;
          if (jobSize._4_4_ == 0) {
            local_298 = 0;
          }
          else {
            local_298 = sStack_d8;
          }
          mtctx->jobs[jobSize._4_4_].prefix.start =
               (void *)((remainingSrcSize + dstBufferPos) - local_298);
          mtctx->jobs[jobSize._4_4_].prefix.size = local_298;
          mtctx->jobs[jobSize._4_4_].src.start = (void *)(remainingSrcSize + dstBufferPos);
          mtctx->jobs[jobSize._4_4_].src.size = (size_t)local_288;
          if (local_288 == (char *)0x0) {
            __assert_fail("jobSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4f6d,
                          "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                         );
          }
          mtctx->jobs[jobSize._4_4_].consumed = 0;
          mtctx->jobs[jobSize._4_4_].cSize = 0;
          if (jobSize._4_4_ == 0) {
            local_2a0 = (ZSTD_CDict *)jobParams.customMem.opaque;
          }
          else {
            local_2a0 = (ZSTD_CDict *)0x0;
          }
          mtctx->jobs[jobSize._4_4_].cdict = local_2a0;
          mtctx->jobs[jobSize._4_4_].fullFrameSize = srcSize;
          memcpy(&mtctx->jobs[jobSize._4_4_].params,&overlapSize,0x90);
          pZVar2 = mtctx->jobs;
          pZVar2[jobSize._4_4_].dstBuff.start = pvVar1;
          pZVar2[jobSize._4_4_].dstBuff.capacity = (size_t)dstBuffer.start;
          mtctx->jobs[jobSize._4_4_].cctxPool = mtctx->cctxPool;
          mtctx->jobs[jobSize._4_4_].bufPool = mtctx->bufPool;
          mtctx->jobs[jobSize._4_4_].seqPool = mtctx->seqPool;
          mtctx->jobs[jobSize._4_4_].serial = &mtctx->serial;
          mtctx->jobs[jobSize._4_4_].jobID = jobSize._4_4_;
          mtctx->jobs[jobSize._4_4_].firstJob = (uint)(jobSize._4_4_ == 0);
          mtctx->jobs[jobSize._4_4_].lastJob = (uint)(jobSize._4_4_ == proposedJobSize._4_4_ - 1);
          POOL_add(mtctx->factory,ZSTDMT_compressionJob,mtctx->jobs + jobSize._4_4_);
          dstBufferPos = (size_t)(local_288 + dstBufferPos);
          cctx = (ZSTD_CCtx *)((long)&cctx->stage + sVar5);
          pcStack_100 = pcStack_100 + -(long)local_288;
        }
        dstPos = 0;
        pZStack_218 = (ZSTDMT_CCtx *)0x0;
        for (cSize._4_4_ = 0; cSize._4_4_ < proposedJobSize._4_4_; cSize._4_4_ = cSize._4_4_ + 1) {
          pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[cSize._4_4_].job_mutex);
          while (mtctx->jobs[cSize._4_4_].consumed < mtctx->jobs[cSize._4_4_].src.size) {
            pthread_cond_wait((pthread_cond_t *)&mtctx->jobs[cSize._4_4_].job_cond,
                              (pthread_mutex_t *)&mtctx->jobs[cSize._4_4_].job_mutex);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[cSize._4_4_].job_mutex);
          sVar5 = mtctx->jobs[cSize._4_4_].cSize;
          uVar4 = ZSTD_isError(sVar5);
          if (uVar4 != 0) {
            dstPos = sVar5;
          }
          if ((dstPos == 0) && (dstCapacity < (long)&pZStack_218->factory + sVar5)) {
            dstPos = 0xffffffffffffffba;
          }
          if (cSize._4_4_ != 0) {
            if (dstPos == 0) {
              memmove((void *)((long)dst + (long)pZStack_218),mtctx->jobs[cSize._4_4_].dstBuff.start
                      ,sVar5);
            }
            if (frameStartPos._4_4_ <= cSize._4_4_) {
              ZSTDMT_releaseBuffer(mtctx->bufPool,mtctx->jobs[cSize._4_4_].dstBuff);
            }
          }
          pZVar2 = mtctx->jobs;
          pZVar2[cSize._4_4_].dstBuff.start = (void *)0x0;
          pZVar2[cSize._4_4_].dstBuff.capacity = 0;
          mtctx->jobs[cSize._4_4_].cSize = 0;
          pZStack_218 = (ZSTDMT_CCtx *)((long)&pZStack_218->factory + sVar5);
        }
        if (params.fParams.checksumFlag != 0) {
          uVar6 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
          if (dstCapacity < (undefined1 *)((long)&pZStack_218->factory + 4U)) {
            dstPos = 0xffffffffffffffba;
          }
          else {
            MEM_writeLE32((void *)((long)dst + (long)pZStack_218),(U32)uVar6);
            pZStack_218 = (ZSTDMT_CCtx *)((long)&pZStack_218->factory + 4);
          }
        }
        if (dstPos == 0) {
          local_2a8 = pZStack_218;
        }
        else {
          local_2a8 = (ZSTDMT_CCtx *)dstPos;
        }
        mtctx_local = local_2a8;
      }
    }
    else {
      mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffc0;
    }
  }
  return (size_t)mtctx_local;
}

Assistant:

static size_t ZSTDMT_compress_advanced_internal(
                ZSTDMT_CCtx* mtctx,
                void* dst, size_t dstCapacity,
          const void* src, size_t srcSize,
          const ZSTD_CDict* cdict,
                ZSTD_CCtx_params params)
{
    ZSTD_CCtx_params const jobParams = ZSTDMT_initJobCCtxParams(&params);
    size_t const overlapSize = ZSTDMT_computeOverlapSize(&params);
    unsigned const nbJobs = ZSTDMT_computeNbJobs(&params, srcSize, params.nbWorkers);
    size_t const proposedJobSize = (srcSize + (nbJobs-1)) / nbJobs;
    size_t const avgJobSize = (((proposedJobSize-1) & 0x1FFFF) < 0x7FFF) ? proposedJobSize + 0xFFFF : proposedJobSize;   /* avoid too small last block */
    const char* const srcStart = (const char*)src;
    size_t remainingSrcSize = srcSize;
    unsigned const compressWithinDst = (dstCapacity >= ZSTD_compressBound(srcSize)) ? nbJobs : (unsigned)(dstCapacity / ZSTD_compressBound(avgJobSize));  /* presumes avgJobSize >= 256 KB, which should be the case */
    size_t frameStartPos = 0, dstBufferPos = 0;
    assert(jobParams.nbWorkers == 0);
    assert(mtctx->cctxPool->totalCCtx == params.nbWorkers);

    params.jobSize = (U32)avgJobSize;
    DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: nbJobs=%2u (rawSize=%u bytes; fixedSize=%u) ",
                nbJobs, (U32)proposedJobSize, (U32)avgJobSize);

    if ((nbJobs==1) | (params.nbWorkers<=1)) {   /* fallback to single-thread mode : this is a blocking invocation anyway */
        ZSTD_CCtx* const cctx = mtctx->cctxPool->cctx[0];
        DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: fallback to single-thread mode");
        if (cdict) return ZSTD_compress_usingCDict_advanced(cctx, dst, dstCapacity, src, srcSize, cdict, jobParams.fParams);
        return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, NULL, 0, &jobParams);
    }

    assert(avgJobSize >= 256 KB);  /* condition for ZSTD_compressBound(A) + ZSTD_compressBound(B) <= ZSTD_compressBound(A+B), required to compress directly into Dst (no additional buffer) */
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(avgJobSize) );
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, avgJobSize, NULL, 0))
        return ERROR(memory_allocation);

    FORWARD_IF_ERROR( ZSTDMT_expandJobsTable(mtctx, nbJobs) );  /* only expands if necessary */

    {   unsigned u;
        for (u=0; u<nbJobs; u++) {
            size_t const jobSize = MIN(remainingSrcSize, avgJobSize);
            size_t const dstBufferCapacity = ZSTD_compressBound(jobSize);
            buffer_t const dstAsBuffer = { (char*)dst + dstBufferPos, dstBufferCapacity };
            buffer_t const dstBuffer = u < compressWithinDst ? dstAsBuffer : g_nullBuffer;
            size_t dictSize = u ? overlapSize : 0;

            mtctx->jobs[u].prefix.start = srcStart + frameStartPos - dictSize;
            mtctx->jobs[u].prefix.size = dictSize;
            mtctx->jobs[u].src.start = srcStart + frameStartPos;
            mtctx->jobs[u].src.size = jobSize; assert(jobSize > 0);  /* avoid job.src.size == 0 */
            mtctx->jobs[u].consumed = 0;
            mtctx->jobs[u].cSize = 0;
            mtctx->jobs[u].cdict = (u==0) ? cdict : NULL;
            mtctx->jobs[u].fullFrameSize = srcSize;
            mtctx->jobs[u].params = jobParams;
            /* do not calculate checksum within sections, but write it in header for first section */
            mtctx->jobs[u].dstBuff = dstBuffer;
            mtctx->jobs[u].cctxPool = mtctx->cctxPool;
            mtctx->jobs[u].bufPool = mtctx->bufPool;
            mtctx->jobs[u].seqPool = mtctx->seqPool;
            mtctx->jobs[u].serial = &mtctx->serial;
            mtctx->jobs[u].jobID = u;
            mtctx->jobs[u].firstJob = (u==0);
            mtctx->jobs[u].lastJob = (u==nbJobs-1);

            DEBUGLOG(5, "ZSTDMT_compress_advanced_internal: posting job %u  (%u bytes)", u, (U32)jobSize);
            DEBUG_PRINTHEX(6, mtctx->jobs[u].prefix.start, 12);
            POOL_add(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[u]);

            frameStartPos += jobSize;
            dstBufferPos += dstBufferCapacity;
            remainingSrcSize -= jobSize;
    }   }

    /* collect result */
    {   size_t error = 0, dstPos = 0;
        unsigned jobID;
        for (jobID=0; jobID<nbJobs; jobID++) {
            DEBUGLOG(5, "waiting for job %u ", jobID);
            ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
            while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
                DEBUGLOG(5, "waiting for jobCompleted signal from job %u", jobID);
                ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
            DEBUGLOG(5, "ready to write job %u ", jobID);

            {   size_t const cSize = mtctx->jobs[jobID].cSize;
                if (ZSTD_isError(cSize)) error = cSize;
                if ((!error) && (dstPos + cSize > dstCapacity)) error = ERROR(dstSize_tooSmall);
                if (jobID) {   /* note : job 0 is written directly at dst, which is correct position */
                    if (!error)
                        memmove((char*)dst + dstPos, mtctx->jobs[jobID].dstBuff.start, cSize);  /* may overlap when job compressed within dst */
                    if (jobID >= compressWithinDst) {  /* job compressed into its own buffer, which must be released */
                        DEBUGLOG(5, "releasing buffer %u>=%u", jobID, compressWithinDst);
                        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);
                }   }
                mtctx->jobs[jobID].dstBuff = g_nullBuffer;
                mtctx->jobs[jobID].cSize = 0;
                dstPos += cSize ;
            }
        }  /* for (jobID=0; jobID<nbJobs; jobID++) */

        DEBUGLOG(4, "checksumFlag : %u ", params.fParams.checksumFlag);
        if (params.fParams.checksumFlag) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            if (dstPos + 4 > dstCapacity) {
                error = ERROR(dstSize_tooSmall);
            } else {
                DEBUGLOG(4, "writing checksum : %08X \n", checksum);
                MEM_writeLE32((char*)dst + dstPos, checksum);
                dstPos += 4;
        }   }

        if (!error) DEBUGLOG(4, "compressed size : %u  ", (U32)dstPos);
        return error ? error : dstPos;
    }
}